

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O2

bool __thiscall
pg::PTLSolver::attractTangle(PTLSolver *this,int t,int pl,bitset *R,bitset *Z,bitset *G)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  pointer piVar4;
  ulong uVar5;
  int *piVar6;
  ostream *poVar7;
  bool bVar8;
  int *piVar9;
  ulong uVar10;
  _label_vertex local_40;
  
  piVar4 = (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  uVar1 = piVar4[t];
  if ((uVar1 != 0xffffffff) && ((pl == -1 || ((uVar1 & 1) == pl)))) {
    bVar8 = false;
    piVar9 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
             super__Vector_impl_data._M_start[t];
    piVar6 = piVar9;
    while( true ) {
      uVar5 = (ulong)*piVar6;
      if (uVar5 == 0xffffffffffffffff) {
        if (!bVar8) {
          return false;
        }
        piVar6 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                 super__Vector_impl_data._M_start[t];
        do {
          uVar5 = (ulong)*piVar6;
          if (uVar5 == 0xffffffffffffffff) {
            piVar9 = piVar9 + 1;
            while( true ) {
              uVar2 = piVar9[-1];
              uVar5 = (ulong)(int)uVar2;
              if (uVar5 == 0xffffffffffffffff) break;
              uVar10 = Z->_bits[uVar5 >> 6];
              if ((uVar10 >> (uVar5 & 0x3f) & 1) == 0) {
                iVar3 = *piVar9;
                Z->_bits[uVar5 >> 6] = uVar10 | 1L << (uVar5 & 0x3f);
                this->str[uVar5] = iVar3;
                iVar3 = (this->Q).pointer;
                (this->Q).pointer = iVar3 + 1;
                (this->Q).queue[iVar3] = uVar2;
                if (2 < (this->super_Solver).trace) {
                  poVar7 = std::operator<<((this->super_Solver).logger,
                                           "\x1b[1;37mattracted \x1b[36m");
                  local_40.g = (this->super_Solver).game;
                  local_40.v = uVar2;
                  poVar7 = operator<<(poVar7,&local_40);
                  poVar7 = std::operator<<(poVar7,"\x1b[m by \x1b[1;36m");
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,pl);
                  std::operator<<(poVar7,"\x1b[m");
                  poVar7 = std::operator<<((this->super_Solver).logger," (via tangle ");
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,t);
                  poVar7 = std::operator<<(poVar7,")");
                  std::endl<char,std::char_traits<char>>(poVar7);
                }
              }
              piVar9 = piVar9 + 2;
            }
            return true;
          }
          piVar6 = piVar6 + 1;
        } while (((Z->_bits[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0) ||
                ((G->_bits[uVar5 >> 6] & 1L << (uVar5 & 0x3f)) == 0));
        return false;
      }
      uVar10 = uVar5 >> 6;
      if (((this->G)._bits[uVar10] >> (uVar5 & 0x3f) & 1) == 0) break;
      uVar5 = 1L << (uVar5 & 0x3f);
      piVar6 = piVar6 + 2;
      if (((Z->_bits[uVar10] & uVar5) == 0) && (bVar8 = true, (R->_bits[uVar10] & uVar5) == 0)) {
        return false;
      }
    }
    piVar4[t] = -1;
  }
  return false;
}

Assistant:

bool
PTLSolver::attractTangle(const int t, const int pl, bitset &R, bitset &Z, bitset &G)
{
    /**
     * Check if tangle is won by player <pl> and not deleted.
     */
    {
        const int tangle_pr = tpr[t];
        if (tangle_pr == -1) return false; // deleted tangle
        if (pl != -1 and pl != (tangle_pr&1)) return false; // not of desired parity
    }

    /**
     * Check if tangle is contained in Z+R and if any vertices are not already in Z
     * If no new vertices could be attracted, then don't attract...
     */
    {
        bool can_attract_new = false;
        int *ptr = tv[t];
        for (;;) {
            const int v = *ptr++;
            if (v == -1) break;
            ptr++; // skip strategy
            if (!this->G[v]) {
                // on-the-fly detect out-of-game tangles
                tpr[t] = -1; // delete the tangle
                return false; // is now a deleted tangle
            } else if (Z[v]) {
                continue; // already attracted
            } else if (R[v]) {
                can_attract_new = true; // has vertices not yet attracted
            } else {
                return false; // not contained in Z+R
            }
        }
        if (!can_attract_new) return false;
    }

    /**
     * Check if the tangle can escape to G\Z.
     */
    {
        int v, *ptr = tout[t];
        while ((v=*ptr++) != -1) {
            if (Z[v]) continue;
            if (G[v]) return false; // opponent escapes
        }
    }

    /**
     * Attract!
     */
    {
        int *ptr = tv[t];
        for (;;) {
            const int v = *ptr++;
            if (v == -1) break;
            const int s = *ptr++;
            if (Z[v]) continue; // already in <Z>
            Z[v] = true;
            str[v] = s;
            Q.push(v);

#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(v) << "\033[m by \033[1;36m" << pl << "\033[m";
                logger << " (via tangle " << t << ")" << std::endl;
            }
#endif
        }
    }

    return true;
}